

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool MultiplyInt64(int64_t a,int64_t b,int64_t *pRet)

{
  long lVar1;
  long lVar2;
  
  lVar1 = b * a;
  lVar2 = SUB168(SEXT816(b) * SEXT816(a),8);
  *pRet = lVar1;
  if ((b ^ a) < 0) {
    if (lVar2 == -1 && lVar1 < 0) {
      return true;
    }
    if (lVar2 == 0 && lVar1 == 0) {
      return true;
    }
  }
  else if (lVar2 == 0) {
    return -1 < lVar1;
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR14 inline bool MultiplyInt64(std::int64_t a, std::int64_t b, std::int64_t* pRet) SAFEINT_NOTHROW
{
    __int128 tmp = (__int128)a * (__int128)b;
    *pRet = (std::int64_t)tmp;
    std::int64_t tmp_high = (std::int64_t)((unsigned __int128)tmp >> 64);

    // If only one input is negative, result must be negative, or zero
    if( (a ^ b) < 0 )
    {
        if( (tmp_high == -1 && *pRet < 0) ||
            (tmp_high == 0 && *pRet == 0))
        {
            return true;            
        } 
    }
    else
    {
        if (tmp_high == 0)
        {
            return (std::uint64_t)*pRet <= (std::uint64_t)std::numeric_limits<std::int64_t>::max();
        }
    }

    return false;
}